

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vod_common.cpp
# Opt level: O2

string * floatToTime_abi_cxx11_(string *__return_storage_ptr__,double time,char msSeparator)

{
  ostream *poVar1;
  int iVar2;
  int msec;
  int sec;
  int min;
  string local_218;
  string local_1f8;
  int hour;
  string local_1d0;
  string local_1b0;
  ostringstream str;
  
  hour = (int)time / 0xe10;
  iVar2 = (int)time % 0xe10;
  min = iVar2 / 0x3c;
  sec = iVar2 % 0x3c;
  msec = (int)((time - (double)(int)time) * 1000.0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  int32ToStr_abi_cxx11_(&local_218,&hour);
  strPadLeft(&local_1f8,&local_218,2,'0');
  poVar1 = std::operator<<((ostream *)&str,(string *)&local_1f8);
  std::operator<<(poVar1,':');
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  int32ToStr_abi_cxx11_(&local_218,&min);
  strPadLeft(&local_1f8,&local_218,2,'0');
  poVar1 = std::operator<<((ostream *)&str,(string *)&local_1f8);
  std::operator<<(poVar1,':');
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  int32ToStr_abi_cxx11_(&local_218,&sec);
  strPadLeft(&local_1f8,&local_218,2,'0');
  poVar1 = std::operator<<((ostream *)&str,(string *)&local_1f8);
  poVar1 = std::operator<<(poVar1,msSeparator);
  int32ToStr_abi_cxx11_(&local_1d0,&msec);
  strPadLeft(&local_1b0,&local_1d0,3,'0');
  std::operator<<(poVar1,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  return __return_storage_ptr__;
}

Assistant:

std::string floatToTime(const double time, const char msSeparator)
{
    int iTime = static_cast<int>(time);
    const int hour = iTime / 3600;
    iTime -= hour * 3600;
    const int min = iTime / 60;
    iTime -= min * 60;
    const int sec = iTime;
    const int msec = static_cast<int>((time - static_cast<int>(time)) * 1000.0);
    std::ostringstream str;
    str << strPadLeft(int32ToStr(hour), 2, '0') << ':';
    str << strPadLeft(int32ToStr(min), 2, '0') << ':';
    str << strPadLeft(int32ToStr(sec), 2, '0') << msSeparator << strPadLeft(int32ToStr(msec), 3, '0');
    return str.str();
}